

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallIndirectExpr
          (BinaryReaderInterp *this,Index sig_index,Index table_index)

{
  Index IVar1;
  bool bVar2;
  Location local_108;
  Var local_e8;
  Location local_a0;
  Var local_80;
  Enum local_38;
  Enum local_34;
  u32 local_30;
  u32 local_2c;
  Index keep_count;
  Index drop_count;
  FuncType *func_type;
  Index table_index_local;
  Index sig_index_local;
  BinaryReaderInterp *this_local;
  
  func_type._0_4_ = table_index;
  func_type._4_4_ = sig_index;
  _table_index_local = this;
  _keep_count = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
                operator[](&this->module_->func_types,(ulong)sig_index);
  local_34 = (Enum)GetReturnCallDropKeepCount(this,_keep_count,1,&local_2c,&local_30);
  bVar2 = Failed((Result)local_34);
  IVar1 = func_type._4_4_;
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Location::Location(&local_a0);
    Var::Var(&local_80,IVar1,&local_a0);
    IVar1 = (Index)func_type;
    Location::Location(&local_108);
    Var::Var(&local_e8,IVar1,&local_108);
    local_38 = (Enum)SharedValidator::OnReturnCallIndirect
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_80
                                ,&local_e8);
    bVar2 = Failed((Result)local_38);
    Var::~Var(&local_e8);
    Var::~Var(&local_80);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Istream::EmitDropKeep(this->istream_,local_2c,local_30);
      Istream::Emit(this->istream_,ReturnCallIndirect,(Index)func_type,func_type._4_4_);
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallIndirectExpr(Index sig_index,
                                                    Index table_index) {
  FuncType& func_type = module_.func_types[sig_index];

  Index drop_count, keep_count;
  // +1 to include the index of the function.
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, +1, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // changes the type stack.
  CHECK_RESULT(
      validator_.OnReturnCallIndirect(loc, Var(sig_index), Var(table_index)));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.Emit(Opcode::ReturnCallIndirect, table_index, sig_index);
  return Result::Ok;
}